

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_viscous(REF_DBL *state,REF_DBL *grad,REF_DBL turb,REF_DBL mach,REF_DBL re,
                REF_DBL reference_temp,REF_DBL *dir,REF_DBL *flux)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  REF_DBL mu_t;
  REF_DBL qdot [3];
  REF_DBL tau [3] [3];
  double local_c0;
  REF_DBL local_b8;
  undefined8 uStack_b0;
  double local_a8 [4];
  double local_88 [13];
  
  local_b8 = *state;
  dVar2 = state[1];
  dVar3 = state[2];
  dVar4 = state[3];
  local_88[10] = state[4];
  uStack_b0 = 0;
  local_88[0xb] = 0.0;
  if (reference_temp <= 0.0) {
    dVar12 = 1.0;
  }
  else {
    auVar14._8_8_ = local_88[10] * 1.4;
    auVar14._0_8_ = 0x405ba3d70a3d70a4;
    auVar15._8_8_ = local_b8;
    auVar15._0_8_ = reference_temp;
    auVar15 = divpd(auVar14,auVar15);
    dVar16 = auVar15._8_8_;
    if (dVar16 < 0.0) {
      dVar12 = sqrt(dVar16);
    }
    else {
      dVar12 = SQRT(dVar16);
    }
    dVar12 = ((auVar15._0_8_ + 1.0) / (auVar15._0_8_ + dVar16)) * dVar16 * dVar12;
  }
  uVar5 = ref_phys_mut_sa(turb,local_b8,dVar12 / local_b8,&local_c0);
  if (uVar5 == 0) {
    dVar16 = (dVar12 + local_c0) * (mach / re);
    pdVar1 = grad + 3;
    pdVar6 = local_88;
    pdVar8 = pdVar1;
    pdVar9 = pdVar1;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      pdVar10 = pdVar8;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        pdVar6[lVar11] = (pdVar9[lVar11] + *pdVar10) * dVar16;
        pdVar10 = pdVar10 + 3;
      }
      dVar13 = local_88[lVar7 * 4];
      pdVar10 = pdVar1;
      for (lVar11 = 0; lVar11 != 0x48; lVar11 = lVar11 + 0x18) {
        dVar13 = dVar13 + *pdVar10 * dVar16 * -0.6666666666666666;
        pdVar10 = pdVar10 + 4;
      }
      local_88[lVar7 * 4] = dVar13;
      pdVar9 = pdVar9 + 3;
      pdVar6 = pdVar6 + 3;
      pdVar8 = pdVar8 + 1;
    }
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      local_a8[lVar7] =
           ((((grad[lVar7 + 0xc] * local_b8 + grad[lVar7] * -local_88[10]) * 1.4) / local_b8) /
           local_b8) * (mach / re) * -(local_c0 / 0.35999999999999993 + dVar12 / 0.2879999999999999)
      ;
    }
    *flux = 0.0;
    flux[1] = dir[2] * local_88[2] + *dir * local_88[0] + dir[1] * local_88[1];
    flux[2] = dir[2] * local_88[5] + *dir * local_88[3] + dir[1] * local_88[4];
    flux[3] = dir[2] * local_88[8] + *dir * local_88[6] + dir[1] * local_88[7];
    flux[4] = ((dVar4 * local_88[8] + dVar2 * local_88[6] + dVar3 * local_88[7]) - local_a8[2]) *
              dir[2] + ((local_88[2] * dVar4 + local_88[0] * dVar2 + local_88[1] * dVar3) -
                       local_a8[0]) * *dir +
                       ((local_88[5] * dVar4 + local_88[3] * dVar2 + local_88[4] * dVar3) -
                       local_a8[1]) * dir[1];
    uVar5 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0xfb,
           "ref_phys_viscous",(ulong)uVar5,"eddy viscosity");
  }
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_phys_viscous(REF_DBL *state, REF_DBL *grad, REF_DBL turb,
                                    REF_DBL mach, REF_DBL re,
                                    REF_DBL reference_temp, REF_DBL *dir,
                                    REF_DBL *flux) {
  REF_DBL rho, u, v, w, p, mu, mu_t, t;
  REF_DBL gamma = 1.4;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL tau[3][3], qdot[3];
  REF_INT i, j, k;
  REF_DBL thermal_conductivity, dtdx;

  rho = state[0];
  u = state[1];
  v = state[2];
  w = state[3];
  p = state[4];
  t = gamma * p / rho;

  RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
  RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
  thermal_conductivity =
      -(mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
  mu += mu_t;

  mu *= mach / re;
  thermal_conductivity *= mach / re;

  for (i = 0; i < 3; i++) {
    for (j = 0; j < 3; j++) {
      tau[i][j] = mu * (grad[j + 3 * (1 + i)] + grad[i + 3 * (1 + j)]);
    }
    for (k = 0; k < 3; k++) {
      tau[i][i] += (-2.0 / 3.0) * mu * grad[k + 3 * (1 + k)];
    }
  }

  for (i = 0; i < 3; i++) {
    /* t = gamma * p / rho quotient rule */
    dtdx = gamma * (grad[i + 3 * 4] * rho - p * grad[i + 3 * 0]) / rho / rho;
    qdot[i] = thermal_conductivity * dtdx;
  }

  flux[0] = 0.0;
  flux[1] = dir[0] * tau[0][0] + dir[1] * tau[0][1] + dir[2] * tau[0][2];
  flux[2] = dir[0] * tau[1][0] + dir[1] * tau[1][1] + dir[2] * tau[1][2];
  flux[3] = dir[0] * tau[2][0] + dir[1] * tau[2][1] + dir[2] * tau[2][2];
  flux[4] = dir[0] * (u * tau[0][0] + v * tau[0][1] + w * tau[0][2] - qdot[0]) +
            dir[1] * (u * tau[1][0] + v * tau[1][1] + w * tau[1][2] - qdot[1]) +
            dir[2] * (u * tau[2][0] + v * tau[2][1] + w * tau[2][2] - qdot[2]);

  return REF_SUCCESS;
}